

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase251::run(TestCase251 *this)

{
  Builder builder;
  Reader reader;
  uint uVar1;
  int fd;
  LowLevelAsyncIoProvider *pLVar2;
  RefOrVoid<kj::AsyncInputStream> pAVar3;
  MessageReader *this_00;
  ArrayPtr<capnp::word> scratchSpace;
  ReaderOptions options;
  undefined8 in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  Reader local_268;
  SourceLocation local_230;
  ArrayPtr<capnp::word> local_218;
  ReaderOptions local_208;
  AsyncInputStream local_1f8;
  undefined1 local_1f0 [8];
  Own<capnp::MessageReader,_std::nullptr_t> received;
  Function<void_()> local_1d0;
  undefined1 local_1c0 [8];
  Thread thread;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined1 local_180 [8];
  TestMessageBuilder message;
  FragmentingOutputStream output;
  SocketOutputStream rawOutput;
  Own<kj::AsyncInputStream,_std::nullptr_t> input;
  undefined1 local_48 [8];
  AsyncIoContext ioContext;
  PipeWithSmallBuffer fds;
  TestCase251 *this_local;
  
  PipeWithSmallBuffer::PipeWithSmallBuffer((PipeWithSmallBuffer *)&ioContext.unixEventPort);
  kj::setupAsyncIo();
  pLVar2 = kj::Own<kj::LowLevelAsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::LowLevelAsyncIoProvider,_std::nullptr_t> *)local_48);
  uVar1 = PipeWithSmallBuffer::operator[]((PipeWithSmallBuffer *)&ioContext.unixEventPort,0);
  (**pLVar2->_vptr_LowLevelAsyncIoProvider)(&rawOutput.fd,pLVar2,(ulong)uVar1,0);
  fd = PipeWithSmallBuffer::operator[]((PipeWithSmallBuffer *)&ioContext.unixEventPort,1);
  kj::FdOutputStream::FdOutputStream((FdOutputStream *)&output.inner,fd);
  FragmentingOutputStream::FragmentingOutputStream
            ((FragmentingOutputStream *)&message.desiredSegmentCount,(OutputStream *)&output.inner);
  TestMessageBuilder::TestMessageBuilder((TestMessageBuilder *)local_180,10);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&thread.detached,(MessageBuilder *)local_180);
  builder._builder.capTable = (CapTableBuilder *)local_198;
  builder._builder.segment = (SegmentBuilder *)uStack_1a0;
  builder._builder.data = (void *)uStack_190;
  builder._builder.pointers = (WirePointer *)local_188;
  builder._builder.dataSize = (int)in_stack_fffffffffffffd60;
  builder._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffd60 >> 0x20);
  builder._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffd60 >> 0x30);
  initTestMessage(builder);
  received.ptr = (MessageReader *)&message.desiredSegmentCount;
  kj::Function<void()>::Function<capnp::_::(anonymous_namespace)::TestCase251::run()::__0>
            ((Function<void()> *)&local_1d0,(Type *)&received.ptr);
  kj::Thread::Thread((Thread *)local_1c0,&local_1d0);
  kj::Function<void_()>::~Function(&local_1d0);
  pAVar3 = kj::Own<kj::AsyncInputStream,_std::nullptr_t>::operator*
                     ((Own<kj::AsyncInputStream,_std::nullptr_t> *)&rawOutput.fd);
  local_208.traversalLimitInWords = 0;
  local_208._8_8_ = 0;
  ReaderOptions::ReaderOptions(&local_208);
  kj::ArrayPtr<capnp::word>::ArrayPtr(&local_218,(void *)0x0);
  scratchSpace.ptr = (word *)(local_208._8_8_ & 0xffffffff);
  scratchSpace.size_ = (size_t)local_218.ptr;
  options._8_8_ = local_208.traversalLimitInWords;
  options.traversalLimitInWords = (uint64_t)pAVar3;
  readMessage(&local_1f8,options,scratchSpace);
  kj::SourceLocation::SourceLocation
            (&local_230,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async-test.c++"
             ,&DAT_009b6b8e,0x109,0x13);
  kj::Promise<kj::Own<capnp::MessageReader,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<capnp::MessageReader,_std::nullptr_t>_> *)local_1f0,&local_1f8);
  kj::Promise<kj::Own<capnp::MessageReader,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<capnp::MessageReader,_std::nullptr_t>_> *)&local_1f8);
  this_00 = kj::Own<capnp::MessageReader,_std::nullptr_t>::operator->
                      ((Own<capnp::MessageReader,_std::nullptr_t> *)local_1f0);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>(&local_268,this_00);
  reader._reader.capTable = (CapTableReader *)local_268._reader.data;
  reader._reader.segment = (SegmentReader *)local_268._reader.capTable;
  reader._reader.data = local_268._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_268._reader._32_8_;
  reader._reader.dataSize = local_268._reader.nestingLimit;
  reader._reader.pointerCount = local_268._reader._44_2_;
  reader._reader._38_2_ = local_268._reader._46_2_;
  reader._reader._40_8_ = in_stack_fffffffffffffd68;
  checkTestMessage(reader);
  kj::Own<capnp::MessageReader,_std::nullptr_t>::~Own
            ((Own<capnp::MessageReader,_std::nullptr_t> *)local_1f0);
  kj::Thread::~Thread((Thread *)local_1c0);
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)local_180);
  FragmentingOutputStream::~FragmentingOutputStream
            ((FragmentingOutputStream *)&message.desiredSegmentCount);
  kj::FdOutputStream::~FdOutputStream((FdOutputStream *)&output.inner);
  kj::Own<kj::AsyncInputStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncInputStream,_std::nullptr_t> *)&rawOutput.fd);
  kj::AsyncIoContext::~AsyncIoContext((AsyncIoContext *)local_48);
  PipeWithSmallBuffer::~PipeWithSmallBuffer((PipeWithSmallBuffer *)&ioContext.unixEventPort);
  return;
}

Assistant:

TEST(SerializeAsyncTest, ParseAsyncEvenSegmentCount) {
  PipeWithSmallBuffer fds;
  auto ioContext = kj::setupAsyncIo();
  auto input = ioContext.lowLevelProvider->wrapInputFd(fds[0]);
  SocketOutputStream rawOutput(fds[1]);
  FragmentingOutputStream output(rawOutput);

  TestMessageBuilder message(10);
  initTestMessage(message.getRoot<TestAllTypes>());

  kj::Thread thread([&]() {
    writeMessage(output, message);
  });

  auto received = readMessage(*input).wait(ioContext.waitScope);

  checkTestMessage(received->getRoot<TestAllTypes>());
}